

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void non_existing_opendir_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == &opendir_req) {
    eval_a = (int64_t)opendir_req.fs_type;
    eval_b = 0x1f;
    if (eval_a == 0x1f) {
      eval_a = opendir_req.result;
      eval_b = -2;
      if (opendir_req.result == -2) {
        if (opendir_req.ptr == (void *)0x0) {
          uv_fs_req_cleanup(&opendir_req);
          non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
          return;
        }
        eval_b = 0;
        pcVar3 = "NULL";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
        pcVar2 = "req->ptr";
        uVar1 = 0xae;
        req = (uv_fs_t *)opendir_req.ptr;
        goto LAB_0012225e;
      }
      pcVar3 = "UV_ENOENT";
      pcVar2 = "req->result";
      uVar1 = 0xad;
    }
    else {
      pcVar3 = "UV_FS_OPENDIR";
      pcVar2 = "req->fs_type";
      uVar1 = 0xac;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    req = (uv_fs_t *)eval_a;
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar1 = 0xab;
    pcVar3 = "&opendir_req";
    eval_b = (int64_t)&opendir_req;
  }
LAB_0012225e:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar1,pcVar2,"==",pcVar3,req,"==",eval_b);
  abort();
}

Assistant:

static void non_existing_opendir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(req->result, UV_ENOENT);
  ASSERT_NULL(req->ptr);

  uv_fs_req_cleanup(req);
  ++non_existing_opendir_cb_count;
}